

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[128],unsigned_long&,long,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [128],
               unsigned_long *params_1,long *params_2,int *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  long *params_01;
  int *params_02;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  undefined8 uStack_88;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[128]>
            ((String *)&stack0xffffffffffffff68,(kj *)params,
             (char (*) [128])CONCAT44(in_register_00000014,severity));
  str<unsigned_long&>(&local_80,(kj *)params_1,params_00);
  str<long&>(&local_68,(kj *)params_2,params_01);
  str<int&>(&local_50,(kj *)params_3,params_02);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff68,in_stack_ffffffffffffff68);
  lVar3 = 0x48;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_88 + lVar3))
                (*(undefined8 **)((long)&uStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}